

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void ScalePlaneBilinearDown
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  int iVar2;
  int *dy_00;
  int *dx_00;
  long lVar3;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int yf;
  uint8_t *src;
  int yi;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int *ScaleFilterCols;
  int j;
  int max_y;
  uint8_t *row;
  uint8_t *row_mem;
  int dy;
  int dx;
  int y;
  int x;
  int test_flag;
  code *local_70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  FilterMode filtering_00;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  code *pcVar4;
  code *local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 local_24;
  int local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  int local_10;
  undefined4 local_c;
  int local_8;
  uint local_4;
  
  filtering_00 = (FilterMode)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_18 = in_R9D;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  dy_00 = (int *)malloc((long)(in_EDI + 0x3f));
  dx_00 = (int *)((long)dy_00 + 0x3fU & 0xffffffffffffffc0);
  iVar1 = (local_8 + -1) * 0x10000;
  if ((int)local_4 < 0x8000) {
    local_70 = ScaleFilterCols_C;
  }
  else {
    local_70 = ScaleFilterCols64_C;
  }
  local_48 = local_70;
  pcVar4 = InterpolateRow_C;
  ScaleSlope(0,0x157800,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,filtering_00,
             (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),dx_00,dy_00);
  local_4 = libyuv::Abs(local_4);
  test_flag = (int)((ulong)&local_24 >> 0x20);
  iVar2 = libyuv::TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (pcVar4 = InterpolateRow_Any_SSSE3, (local_4 & 0xf) == 0)) {
    pcVar4 = InterpolateRow_SSSE3;
  }
  iVar2 = libyuv::TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (pcVar4 = InterpolateRow_Any_AVX2, (local_4 & 0x1f) == 0)) {
    pcVar4 = InterpolateRow_AVX2;
  }
  iVar2 = libyuv::TestCpuFlag(test_flag);
  if ((iVar2 != 0) && ((int)local_4 < 0x8000)) {
    local_48 = ScaleFilterCols_SSSE3;
  }
  if (iVar1 < local_20) {
    local_20 = iVar1;
  }
  for (iVar2 = 0; iVar2 < local_10; iVar2 = iVar2 + 1) {
    lVar3 = in_stack_00000008 + (local_20 >> 0x10) * local_14;
    if (in_stack_00000018 == 1) {
      (*local_48)(in_stack_00000010,lVar3,local_c,local_1c,local_24);
    }
    else {
      (*pcVar4)(dx_00,lVar3,(long)local_14,local_4,local_20 >> 8 & 0xff);
      (*local_48)(in_stack_00000010,dx_00,local_c,local_1c,local_24);
    }
    in_stack_00000010 = in_stack_00000010 + local_18;
    if (iVar1 < local_20) {
      local_20 = iVar1;
    }
  }
  free(dy_00);
  return;
}

Assistant:

void ScalePlaneBilinearDown(int src_width,
                            int src_height,
                            int dst_width,
                            int dst_height,
                            int src_stride,
                            int dst_stride,
                            const uint8_t* src_ptr,
                            uint8_t* dst_ptr,
                            enum FilterMode filtering) {
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  // TODO(fbarchard): Consider not allocating row buffer for kFilterLinear.
  // Allocate a row buffer.
  align_buffer_64(row, src_width);

  const int max_y = (src_height - 1) << 16;
  int j;
  void (*ScaleFilterCols)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                          int dst_width, int x, int dx) =
      (src_width >= 32768) ? ScaleFilterCols64_C : ScaleFilterCols_C;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

#if defined(HAS_SCALEFILTERCOLS_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_NEON)
  if (TestCpuFlag(kCpuHasNEON) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_MSA)
  if (TestCpuFlag(kCpuHasMSA) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleFilterCols = ScaleFilterCols_MSA;
    }
  }
#endif
  if (y > max_y) {
    y = max_y;
  }

  for (j = 0; j < dst_height; ++j) {
    int yi = y >> 16;
    const uint8_t* src = src_ptr + yi * src_stride;
    if (filtering == kFilterLinear) {
      ScaleFilterCols(dst_ptr, src, dst_width, x, dx);
    } else {
      int yf = (y >> 8) & 255;
      InterpolateRow(row, src, src_stride, src_width, yf);
      ScaleFilterCols(dst_ptr, row, dst_width, x, dx);
    }
    dst_ptr += dst_stride;
    y += dy;
    if (y > max_y) {
      y = max_y;
    }
  }
  free_aligned_buffer_64(row);
}